

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::callback
          (AsyncCase *this,GLenum source,GLenum type,GLuint id,GLenum severity,string *message)

{
  mapped_type *pmVar1;
  ScopedLock lock;
  key_type local_2c;
  
  deMutex_lock((this->m_mutex).m_mutex);
  local_2c.source = source;
  local_2c.type = type;
  local_2c.id = id;
  pmVar1 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
           ::operator[](&this->m_counts,&local_2c);
  pmVar1->received = pmVar1->received + 1;
  deMutex_unlock((this->m_mutex).m_mutex);
  return;
}

Assistant:

void AsyncCase::callback (GLenum source, GLenum type, GLuint id, GLenum severity, const string& message)
{
	DE_ASSERT(m_useCallbacks);
	DE_UNREF(severity);
	DE_UNREF(message);

	de::ScopedLock lock(m_mutex);

	m_counts[MessageID(source, type, id)].received++;
}